

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context.hpp
# Opt level: O0

return_type __thiscall
asio::io_context::
post<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
          (io_context *this,
          wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
          *handler)

{
  undefined1 uVar1;
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  *h;
  async_completion<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_void_()>
  *in_RDI;
  ptr p;
  bool is_continuation;
  async_completion<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_void_()>
  init;
  wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
  *in_stack_ffffffffffffff98;
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffd8;
  scheduler *in_stack_ffffffffffffffe0;
  
  async_completion<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_void_()>
  ::async_completion(in_RDI,in_stack_ffffffffffffff98);
  uVar1 = asio_handler_cont_helpers::
          is_continuation<asio::detail::wrapped_handler<asio::io_context::strand,std::function<void()>,asio::detail::is_continuation_if_running>>
                    ((wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                      *)0x2ce6a1);
  h = detail::
      completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
      ::ptr::allocate((wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
                       *)in_stack_ffffffffffffffb0);
  detail::
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  ::completion_handler
            (in_stack_ffffffffffffffb0,
             (wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>
              *)h);
  detail::scheduler::post_immediate_completion
            (in_stack_ffffffffffffffe0,(operation *)CONCAT17(uVar1,in_stack_ffffffffffffffd8),
             SUB81((ulong)h >> 0x38,0));
  async_result<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_void_()>
  ::get((async_result<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>,_void_()>
         *)0x2ce720);
  detail::
  completion_handler<asio::detail::wrapped_handler<asio::io_context::strand,_std::function<void_()>,_asio::detail::is_continuation_if_running>_>
  ::ptr::~ptr((ptr *)0x2ce72c);
  return;
}

Assistant:

io_context::post(ASIO_MOVE_ARG(LegacyCompletionHandler) handler)
{
  // If you get an error on the following line it means that your handler does
  // not meet the documented type requirements for a LegacyCompletionHandler.
  ASIO_LEGACY_COMPLETION_HANDLER_CHECK(
      LegacyCompletionHandler, handler) type_check;

  async_completion<LegacyCompletionHandler, void ()> init(handler);

  bool is_continuation =
    asio_handler_cont_helpers::is_continuation(init.completion_handler);

  // Allocate and construct an operation to wrap the handler.
  typedef detail::completion_handler<
    typename handler_type<LegacyCompletionHandler, void ()>::type> op;
  typename op::ptr p = { detail::addressof(init.completion_handler),
      op::ptr::allocate(init.completion_handler), 0 };
  p.p = new (p.v) op(init.completion_handler);

  ASIO_HANDLER_CREATION((*this, *p.p,
        "io_context", this, 0, "post"));

  impl_.post_immediate_completion(p.p, is_continuation);
  p.v = p.p = 0;

  return init.result.get();
}